

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_api.h
# Opt level: O0

ssize_t __thiscall dummy_api::write(dummy_api *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar2;
  size_t i;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> all;
  bool block;
  const_buffer in;
  value_type *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  buffer_impl<const_char_*> *in_stack_ffffffffffffff40;
  ulong uVar3;
  string local_a0 [35];
  byte local_7d;
  undefined4 local_7c;
  error_code local_78 [2];
  undefined1 local_58 [48];
  undefined8 *local_28;
  byte local_19;
  undefined8 local_18;
  dummy_api *local_10;
  byte local_1;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  local_19 = (byte)__buf & 1;
  local_28 = (undefined8 *)__n;
  local_10 = this;
  (**(code **)(*(long *)this + 0x50))(local_58,this,local_18,local_19,__n);
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    std::error_code::error_code(local_78,3,booster::aio::aio_error_cat);
    *local_28 = local_78[0]._0_8_;
    local_28[1] = local_78[0]._M_cat;
    local_1 = 0;
  }
  else {
    local_7d = 0;
    std::__cxx11::string::substr((ulong)local_a0,(ulong)this->output_);
    bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_a0);
    if (bVar1) {
      bVar1 = std::vector<char,_std::allocator<char>_>::empty
                        ((vector<char,_std::allocator<char>_> *)this);
      if (bVar1) {
        std::vector<char,_std::allocator<char>_>::push_back
                  ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff20,
                   in_stack_ffffffffffffff18);
      }
      local_7d = 1;
    }
    pVar2 = booster::aio::buffer_impl<const_char_*>::get(in_stack_ffffffffffffff40);
    if (pVar2.second != 0) {
      if ((this->mark_chunks_ & 1U) != 0) {
        std::__cxx11::string::append((char *)this->output_);
      }
      for (uVar3 = 0; uVar3 < pVar2.second; uVar3 = uVar3 + 1) {
        std::__cxx11::string::append((char *)this->output_,(ulong)pVar2.first[uVar3].ptr);
      }
      if ((this->mark_chunks_ & 1U) != 0) {
        std::__cxx11::string::append((char *)this->output_);
      }
    }
    if (((local_19 & 1) != 0) && ((this->write_eof_ & 1U) != 0)) {
      std::__cxx11::string::append((char *)this->output_);
    }
    local_1 = (local_7d ^ 0xff) & 1;
  }
  local_7c = 1;
  booster::aio::const_buffer::~const_buffer((const_buffer *)0x1621f7);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffffffffffff01;
}

Assistant:

virtual bool write(booster::aio::const_buffer const &body_in,bool eof,booster::system::error_code &e) 
	{
		booster::aio::const_buffer in = format_output(body_in,eof,e);
		if(*output_ == "$$$ERROR$$$") {
			e=booster::system::error_code(booster::aio::aio_error::eof,booster::aio::aio_error_cat);
			return false;
		}
		bool block = false;
		if(output_->substr(0,3+5+3) == "$$$BLOCK$$$") {
			if(pending_output_.empty())
				pending_output_.push_back('x');
			block = true;
		}
		std::pair<booster::aio::const_buffer::entry const *,size_t> all=in.get();
		if(all.second!=0) {
			if(mark_chunks_)
				output_->append("[");
			for(size_t i=0;i<all.second;i++)  {
				output_->append(reinterpret_cast<char const *>(all.first[i].ptr),all.first[i].size);
			}
			if(mark_chunks_)
				output_->append("]");
		}
		if(eof && write_eof_)
			output_->append("[EOF]");
		return !block;
	}